

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::neg(Literal *__return_storage_ptr__,Literal *this)

{
  BasicType BVar1;
  anon_union_16_5_9943fe1e_for_Literal_0 local_30;
  undefined8 local_20;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  switch(BVar1) {
  case none:
  case unreachable:
  case v128:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                       ,0x35a);
  case i32:
    (__return_storage_ptr__->field_0).i32 = -(this->field_0).i32;
    (__return_storage_ptr__->type).id = 2;
    return __return_storage_ptr__;
  case i64:
    (__return_storage_ptr__->field_0).i64 = -(this->field_0).i64;
    (__return_storage_ptr__->type).id = 3;
    return __return_storage_ptr__;
  case f32:
    local_30.func.super_IString.str._M_len =
         CONCAT44(local_30.i64._4_4_,(this->field_0).i32) ^ 0x80000000;
    local_20 = 2;
    castToF32(__return_storage_ptr__,(Literal *)&local_30.func);
    break;
  case f64:
    local_30.func.super_IString.str._M_len =
         (this->field_0).func.super_IString.str._M_len ^ 0x8000000000000000;
    local_20 = 3;
    castToF64(__return_storage_ptr__,(Literal *)&local_30.func);
    break;
  default:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                       ,0x35c);
  }
  ~Literal((Literal *)&local_30.func);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::neg() const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(-uint32_t(i32));
    case Type::i64:
      return Literal(-uint64_t(i64));
    case Type::f32:
      return Literal(i32 ^ 0x80000000).castToF32();
    case Type::f64:
      return Literal(int64_t(i64 ^ 0x8000000000000000ULL)).castToF64();
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("invalid type");
}